

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

void us_poll_stop(us_poll_t *p,us_loop_t *loop)

{
  epoll_event *__event;
  int in_R8D;
  epoll_event event;
  
  __event = (epoll_event *)&event;
  epoll_ctl(loop->fd,2,((int)p->state << 4) >> 4,__event);
  us_internal_loop_update_pending_ready_polls(loop,p,(us_poll_t *)0x0,(int)__event,in_R8D);
  return;
}

Assistant:

void us_poll_stop(struct us_poll_t *p, struct us_loop_t *loop) {
    int old_events = us_poll_events(p);
    int new_events = 0;
#ifdef LIBUS_USE_EPOLL
    struct epoll_event event;
    epoll_ctl(loop->fd, EPOLL_CTL_DEL, p->state.fd, &event);
#else
    if (old_events) {
        kqueue_change(loop->fd, p->state.fd, old_events, new_events, NULL);
    }
#endif

    /* Disable any instance of us in the pending ready poll list */
    us_internal_loop_update_pending_ready_polls(loop, p, 0, old_events, new_events);
}